

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

adt_hkey_t * adt_hnode_find(adt_hnode_t *node,char *key,uint32_t u32Hash)

{
  adt_hkey_t *paVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  adt_hkey_tag **ppaVar5;
  
  for (; node->u8Width == '\x10';
      node = (adt_hnode_t *)
             ((long)&((node->child).match)->u32Hash +
             (ulong)((u32Hash >> ((node->u8Depth & 7) << 2) & 0xf) << 4))) {
  }
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if ((ulong)node->u8Cur * 0x10 + 0x10 == lVar4 + 0x10) {
      return (adt_hkey_t *)0x0;
    }
    lVar2 = lVar4 + 0x10;
  } while (*(uint32_t *)((long)&((node->child).match)->u32Hash + lVar4) != u32Hash);
  ppaVar5 = (adt_hkey_tag **)((long)&((node->child).match)->key + lVar4);
  while( true ) {
    paVar1 = *ppaVar5;
    if (paVar1 == (adt_hkey_t *)0x0) {
      return (adt_hkey_t *)0x0;
    }
    iVar3 = strcmp(paVar1->key,key);
    if (iVar3 == 0) break;
    ppaVar5 = &paVar1->next;
  }
  return paVar1;
}

Assistant:

adt_hkey_t * adt_hnode_find(const adt_hnode_t *node, const char *key,uint32_t u32Hash){
	if(node->u8Width == 16){
			uint8_t u8Bucket = (uint8_t) ( (u32Hash >> (node->u8Depth*4)) & 0xF);
			return adt_hnode_find(&node->child.node[u8Bucket],key,u32Hash);
	}
	else{
		int i;
		for(i=0;i<node->u8Cur;i++){
			if(node->child.match[i].u32Hash == u32Hash){
				adt_hkey_t *hkey = node->child.match[i].key;
				while( (hkey) && (strcmp(hkey->key,key)!=0) ){
					hkey = hkey->next;
				}
				return hkey;
			}
		}
	}
	return 0;
}